

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O2

SampledSpectrum __thiscall pbrt::TabulatedBSSRDF::Sr(TabulatedBSSRDF *this,Float r)

{
  Float x;
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int ch;
  long lVar5;
  int i;
  long lVar6;
  int j;
  long lVar7;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [56];
  undefined1 auVar13 [64];
  span<float> weights;
  span<float> weights_00;
  SampledSpectrum SVar14;
  span<const_float> nodes;
  span<const_float> nodes_00;
  int radiusOffset;
  Float local_8c;
  float local_88;
  int rhoOffset;
  SampledSpectrum *local_80;
  Float rhoWeights [4];
  SampledSpectrum Sr;
  Float radiusWeights [4];
  undefined1 extraout_var [60];
  
  auVar9 = ZEXT1264(ZEXT812(0));
  local_8c = r;
  SampledSpectrum::SampledSpectrum(&Sr,0.0);
  local_80 = &this->sigma_t;
  lVar5 = 0;
  while( true ) {
    auVar12 = in_ZMM1._8_56_;
    auVar11 = auVar9._8_56_;
    if (lVar5 == 4) break;
    fVar8 = local_8c * (this->sigma_t).values.values[lVar5];
    x = (this->rho).values.values[lVar5];
    auVar9 = ZEXT464((uint)x);
    weights.n = 4;
    weights.ptr = rhoWeights;
    nodes.n = (this->table->rhoSamples).nStored;
    nodes.ptr = (this->table->rhoSamples).ptr;
    bVar4 = CatmullRomWeights(nodes,x,&rhoOffset,weights);
    if (bVar4) {
      auVar9 = ZEXT464((uint)fVar8);
      weights_00.n = 4;
      weights_00.ptr = radiusWeights;
      nodes_00.n = (this->table->radiusSamples).nStored;
      nodes_00.ptr = (this->table->radiusSamples).ptr;
      bVar4 = CatmullRomWeights(nodes_00,fVar8,&radiusOffset,weights_00);
      if (bVar4) {
        auVar13 = ZEXT1664(ZEXT816(0) << 0x40);
        for (lVar6 = 0; in_ZMM1 = ZEXT464((uint)fVar8), lVar6 != 4; lVar6 = lVar6 + 1) {
          for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
            fVar1 = rhoWeights[lVar6] * radiusWeights[lVar7];
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              local_88 = fVar1;
              auVar10._0_4_ =
                   BSSRDFTable::EvalProfile
                             (this->table,rhoOffset + (int)lVar6,radiusOffset + (int)lVar7);
              auVar10._4_60_ = extraout_var;
              auVar3 = vfmadd231ss_fma(auVar13._0_16_,auVar10._0_16_,ZEXT416((uint)local_88));
              auVar13 = ZEXT1664(auVar3);
            }
          }
        }
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT416(0),4);
        bVar4 = (bool)((byte)uVar2 & 1);
        fVar8 = auVar13._0_4_ / (fVar8 * 6.2831855);
        auVar9 = ZEXT1664(CONCAT124(auVar13._4_12_,fVar8));
        Sr.values.values[lVar5] =
             (float)((uint)bVar4 * (int)fVar8 + (uint)!bVar4 * (int)auVar13._0_4_);
      }
    }
    lVar5 = lVar5 + 1;
  }
  SVar14 = SampledSpectrum::operator*(local_80,local_80);
  auVar13._0_8_ = SVar14.values.values._8_8_;
  auVar13._8_56_ = auVar12;
  auVar9._0_8_ = SVar14.values.values._0_8_;
  auVar9._8_56_ = auVar11;
  rhoWeights = (Float  [4])vmovlhps_avx(auVar9._0_16_,auVar13._0_16_);
  SampledSpectrum::operator*=(&Sr,(SampledSpectrum *)rhoWeights);
  SVar14 = ClampZero(&Sr);
  return (array<float,_4>)(array<float,_4>)SVar14;
}

Assistant:

PBRT_CPU_GPU
    SampledSpectrum Sr(Float r) const {
        SampledSpectrum Sr(0.f);
        for (int ch = 0; ch < NSpectrumSamples; ++ch) {
            // Convert $r$ into unitless optical radius $r_{\roman{optical}}$
            Float rOptical = r * sigma_t[ch];

            // Compute spline weights to interpolate BSSRDF on channel _ch_
            int rhoOffset, radiusOffset;
            Float rhoWeights[4], radiusWeights[4];
            if (!CatmullRomWeights(table->rhoSamples, rho[ch], &rhoOffset, rhoWeights) ||
                !CatmullRomWeights(table->radiusSamples, rOptical, &radiusOffset,
                                   radiusWeights))
                continue;

            // Set BSSRDF value _Sr[ch]_ using tensor spline interpolation
            Float sr = 0;
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j) {
                    // Accumulate contribution of $(i,j)$ table sample
                    if (Float weight = rhoWeights[i] * radiusWeights[j]; weight != 0)
                        sr +=
                            weight * table->EvalProfile(rhoOffset + i, radiusOffset + j);
                }
            // Cancel marginal PDF factor from tabulated BSSRDF profile
            if (rOptical != 0)
                sr /= 2 * Pi * rOptical;

            Sr[ch] = sr;
        }
        // Transform BSSRDF value into world space units
        Sr *= sigma_t * sigma_t;

        return ClampZero(Sr);
    }